

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O3

DBKeyID __thiscall
anon_unknown.dwarf_4da258::SQLiteBuildDB::getKeyID
          (SQLiteBuildDB *this,KeyID keyID,string *error_out)

{
  bool bVar1;
  int iVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *ConstFoundBucket;
  string local_70;
  KeyID local_50;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *local_48;
  undefined4 local_40;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> local_38;
  DBKeyID local_28;
  
  local_50._value = keyID._value;
  bVar1 = llvm::
          DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
          ::LookupBucketFor<llbuild::core::KeyID>
                    ((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                      *)&this->dbKeyIDs,&local_50,&local_48);
  if ((bVar1) && (local_48 != (this->dbKeyIDs).Buckets + (this->dbKeyIDs).NumBuckets)) {
    return (DBKeyID)(local_48->super_pair<llbuild::core::KeyID,_DBKeyID>).second.value;
  }
  (*this->delegate->_vptr_BuildDBDelegate[3])(&local_48,this->delegate,local_50._value);
  iVar2 = sqlite3_reset(this->findKeyIDForKeyStmt);
  if (((iVar2 == 0) && (iVar2 = sqlite3_clear_bindings(this->findKeyIDForKeyStmt), iVar2 == 0)) &&
     (iVar2 = sqlite3_bind_text(this->findKeyIDForKeyStmt,1,local_48,local_40,0), iVar2 == 0)) {
    iVar2 = sqlite3_step(this->findKeyIDForKeyStmt);
    if (iVar2 == 100) {
      iVar2 = sqlite3_column_count(this->findKeyIDForKeyStmt);
      if (iVar2 != 1) {
        __assert_fail("sqlite3_column_count(findKeyIDForKeyStmt) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                      ,0x398,
                      "DBKeyID (anonymous namespace)::SQLiteBuildDB::getKeyIDFromDB(KeyID, std::string *)"
                     );
      }
      local_28.value = sqlite3_column_int64(this->findKeyIDForKeyStmt,0);
      goto LAB_001bd5d3;
    }
    iVar2 = sqlite3_reset(this->insertIntoKeysStmt);
    if (((iVar2 == 0) && (iVar2 = sqlite3_clear_bindings(this->insertIntoKeysStmt), iVar2 == 0)) &&
       ((iVar2 = sqlite3_bind_text(this->insertIntoKeysStmt,1,local_48,local_40,0), iVar2 == 0 &&
        (iVar2 = sqlite3_step(this->insertIntoKeysStmt), iVar2 == 0x65)))) {
      local_28.value = sqlite3_last_insert_rowid(this->db);
      goto LAB_001bd5d3;
    }
  }
  (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_70,this);
  std::__cxx11::string::operator=((string *)error_out,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_28.value = 0;
LAB_001bd5d3:
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38.super_pair<llbuild::core::KeyID,_DBKeyID>.first._value + 1);
  }
  if (local_28.value == 0) {
    local_28.value = 0;
  }
  else {
    pvVar3 = llvm::
             DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
             ::FindAndConstruct((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                                 *)&this->engineKeyIDs,&local_28);
    (pvVar3->super_pair<DBKeyID,_llbuild::core::KeyID>).second._value = local_50._value;
    pvVar4 = llvm::
             DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
             ::FindAndConstruct((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                                 *)&this->dbKeyIDs,&local_50);
    (pvVar4->super_pair<llbuild::core::KeyID,_DBKeyID>).second.value = local_28.value;
  }
  return (DBKeyID)local_28.value;
}

Assistant:

DBKeyID getKeyID(KeyID keyID, std::string *error_out) {
    // Try to fetch the DBKeyID from the cache
    auto it = dbKeyIDs.find(keyID);
    if (it != dbKeyIDs.end()) {
      return it->second;
    }

    auto dbKeyID = getKeyIDFromDB(keyID, error_out);

    if (dbKeyID.value != 0) {
      // Cache the ID mappings
      engineKeyIDs[dbKeyID] = keyID;
      dbKeyIDs[keyID] = dbKeyID;
    }

    return dbKeyID;
  }